

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TryHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Value *dstVal,Value *src1Val,Value *src2Val,
          bool isNotTypeSpecConv,bool lossy,bool forceInvariantHoisting,BailOutKind bailoutKind)

{
  Loop *loop;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  BVIndex BVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  Loop **ppLVar7;
  undefined1 local_f0 [8];
  NoRecoverMemoryJitArenaAllocator tempAllocator;
  PropertySym *propertySymUse;
  
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3cc6,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
    if (!bVar2) goto LAB_00428863;
    *puVar5 = 0;
  }
  bVar2 = OptIsInvariant(this,instr,block,block->loop,src1Val,src2Val,isNotTypeSpecConv,
                         forceInvariantHoisting);
  if (bVar2) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01453738,InvariantsPhase,sourceContextId,functionId);
    if (bVar3) {
      Output::Print(L" **** INVARIANT  ***   ");
      IR::Instr::Dump(instr);
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InvariantsPhase);
    if (bVar3) {
      Output::Print(L" **** INVARIANT  ***   ");
      pcVar6 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L"%s \n",pcVar6);
    }
    ppLVar7 = &block->loop;
    do {
      loop = *ppLVar7;
      if (loop->parent == (Loop *)0x0) break;
      ppLVar7 = &loop->parent;
      bVar3 = OptIsInvariant(this,instr,block,loop->parent,src1Val,src2Val,isNotTypeSpecConv,
                             forceInvariantHoisting);
    } while (bVar3);
    if (isNotTypeSpecConv) {
      InsertNoImplicitCallUses(this,instr);
      CaptureByteCodeSymUses(this,instr);
      InsertByteCodeUses(this,instr,true);
    }
    else {
      tempAllocator.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)0x0;
      Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
                ((NoRecoverMemoryJitArenaAllocator *)local_f0,L"BE-GlobOpt-Temp",
                 (this->alloc->super_ArenaAllocator).
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
      instrByteCodeStackSymUsed =
           (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,(JitArenaAllocator *)local_f0,0x3d6ef4);
      instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
      instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
      instrByteCodeStackSymUsed->alloc = (JitArenaAllocator *)local_f0;
      instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
      TrackByteCodeSymUsed
                (instr,instrByteCodeStackSymUsed,
                 (PropertySym **)&tempAllocator.super_JitArenaAllocator.bvFreeList);
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Count(instrByteCodeStackSymUsed);
      if ((BVar4 != 0) || (tempAllocator.super_JitArenaAllocator.bvFreeList != (BVSparseNode *)0x0))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3cee,"(tempByteCodeUse->Count() == 0 && propertySymUse == __null)",
                           "tempByteCodeUse->Count() == 0 && propertySymUse == NULL");
        if (!bVar3) {
LAB_00428863:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
      ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          local_f0);
    }
    OptHoistInvariant(this,instr,block,loop,dstVal,src1Val,src2Val,isNotTypeSpecConv,lossy,
                      bailoutKind);
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::TryHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    bool isNotTypeSpecConv,
    const bool lossy,
    const bool forceInvariantHoisting,
    IR::BailOutKind bailoutKind)
{
    Assert(!this->IsLoopPrePass());

    if (OptIsInvariant(instr, block, block->loop, src1Val, src2Val, isNotTypeSpecConv, forceInvariantHoisting))
    {
#if DBG
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::InvariantsPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            Output::Print(_u(" **** INVARIANT  ***   "));
            instr->Dump();
        }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InvariantsPhase))
        {
            Output::Print(_u(" **** INVARIANT  ***   "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
        Loop *loop = block->loop;

        // Try hoisting from to outer most loop
        while (loop->parent && OptIsInvariant(instr, block, loop->parent, src1Val, src2Val, isNotTypeSpecConv, forceInvariantHoisting))
        {
            loop = loop->parent;
        }

        // Record the byte code use here since we are going to move this instruction up
        if (isNotTypeSpecConv)
        {
            InsertNoImplicitCallUses(instr);
            this->CaptureByteCodeSymUses(instr);
            this->InsertByteCodeUses(instr, true);
        }
#if DBG
        else
        {
            PropertySym *propertySymUse = NULL;
            NoRecoverMemoryJitArenaAllocator tempAllocator(_u("BE-GlobOpt-Temp"), this->alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
            BVSparse<JitArenaAllocator> * tempByteCodeUse = JitAnew(&tempAllocator, BVSparse<JitArenaAllocator>, &tempAllocator);
            GlobOpt::TrackByteCodeSymUsed(instr, tempByteCodeUse, &propertySymUse);
            Assert(tempByteCodeUse->Count() == 0 && propertySymUse == NULL);
        }
#endif
        OptHoistInvariant(instr, block, loop, dstVal, src1Val, src2Val, isNotTypeSpecConv, lossy, bailoutKind);
        return true;
    }

    return false;
}